

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Error asmjit::Logging::formatRegister
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                uint32_t regType,uint32_t regId)

{
  char *str;
  bool bVar1;
  Error in_EAX;
  Error EVar2;
  ulong uVar3;
  undefined4 in_register_0000000c;
  ulong uVar4;
  char *fmt;
  
  if (regId < 0x100) {
    fmt = "PhysReg<Type=%u Id=%u>";
    if (regType < 0x20) {
      uVar3 = (ulong)regType;
      if (regId < (byte)x86RegFormatInfo[uVar3 * 4 + 3]) {
        EVar2 = StringBuilder::_opString
                          (sb,1,x86RegFormatStrings +
                                (ulong)regId * 4 + (ulong)(byte)x86RegFormatInfo[uVar3 * 4 + 2],
                           0xffffffffffffffff);
        bVar1 = false;
      }
      else if (regId < (byte)x86RegFormatInfo[uVar3 * 4]) {
        bVar1 = false;
        EVar2 = StringBuilder::appendFormat
                          (sb,x86RegFormatStrings + (byte)x86RegFormatInfo[uVar3 * 4 + 1],
                           (ulong)regId);
      }
      else {
        bVar1 = true;
        EVar2 = regType;
      }
      if (!bVar1) {
        return EVar2;
      }
    }
  }
  else {
    fmt = "VirtReg<Type=%u Id=%u>";
    if ((emitter != (CodeEmitter *)0x0) && (emitter->_type == '\x03')) {
      uVar4 = (ulong)(regId - 0x100);
      uVar3 = *(ulong *)&emitter[3]._none.field_0;
      if (uVar4 < uVar3) {
        if (regId == 0xffffffff) {
          X86Logging::formatRegister();
LAB_00166f2a:
          X86Logging::formatRegister();
        }
        if (*(long *)(emitter[3]._inlineComment + uVar4 * 8) == 0) goto LAB_00166f2a;
        str = *(char **)(*(long *)(emitter[3]._inlineComment + uVar4 * 8) + 8);
        if ((str == (char *)0x0) || (*str == '\0')) {
          in_EAX = StringBuilder::appendFormat
                             (sb,"v%u",uVar4,CONCAT44(in_register_0000000c,archType));
        }
        else {
          in_EAX = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
        }
      }
      if (uVar4 < uVar3) {
        return in_EAX;
      }
    }
  }
  EVar2 = StringBuilder::appendFormat(sb,fmt,(ulong)regType,(ulong)regId);
  return EVar2;
}

Assistant:

Error Logging::formatRegister(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  uint32_t regType,
  uint32_t regId) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatRegister(sb, logOptions, emitter, archType, regType, regId);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatRegister(sb, logOptions, emitter, archType, regType, regId);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}